

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleTimestampCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 name;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 local_120 [8];
  string result;
  undefined1 local_f8 [3];
  cmTimestamp timestamp;
  undefined1 local_d8 [8];
  string e;
  undefined1 local_b0 [7];
  bool utcFlag;
  string formatString;
  string *outputVariable;
  string *filename;
  uint argsIndex;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command TIMESTAMP requires at least two arguments.",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
    goto LAB_004f300c;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (5 < sVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&argsIndex,"sub-command TIMESTAMP takes at most four arguments.",
               (allocator *)((long)&filename + 7));
    cmCommand::SetError(&this->super_cmCommand,(string *)&argsIndex);
    std::__cxx11::string::~string((string *)&argsIndex);
    std::allocator<char>::~allocator((allocator<char> *)((long)&filename + 7));
    this_local._7_1_ = 0;
    goto LAB_004f300c;
  }
  filename._0_4_ = 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_20,1);
  uVar5 = (ulong)(uint)filename;
  filename._0_4_ = (uint)filename + 1;
  formatString.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[](local_20,uVar5);
  std::__cxx11::string::string((string *)local_b0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if ((uint)filename < sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)filename);
    bVar1 = std::operator!=(pvVar3,"UTC");
    if (bVar1) {
      uVar5 = (ulong)(uint)filename;
      filename._0_4_ = (uint)filename + 1;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,uVar5);
      std::__cxx11::string::operator=((string *)local_b0,(string *)pvVar3);
    }
  }
  e.field_2._M_local_buf[0xf] = '\0';
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if ((uint)filename < sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)filename);
    bVar1 = std::operator==(pvVar3,"UTC");
    if (bVar1) {
      e.field_2._M_local_buf[0xf] = '\x01';
      goto LAB_004f2f34;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   " TIMESTAMP sub-command does not recognize option ",pvVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"."
                  );
    std::__cxx11::string::~string((string *)local_f8);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_d8);
    this_local._7_1_ = 0;
    result.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
LAB_004f2f34:
    cmTimestamp::cmTimestamp((cmTimestamp *)(result.field_2._M_local_buf + 0xb));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmTimestamp::FileModificationTime
              ((string *)local_120,(cmTimestamp *)(result.field_2._M_local_buf + 0xb),pcVar4,
               (string *)local_b0,(bool)(e.field_2._M_local_buf[0xf] & 1));
    name = formatString.field_2._8_8_;
    this_00 = (this->super_cmCommand).Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,pcVar4);
    this_local._7_1_ = 1;
    result.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_120);
  }
  std::__cxx11::string::~string((string *)local_b0);
LAB_004f300c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleTimestampCommand(
  std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("sub-command TIMESTAMP requires at least two arguments.");
    return false;
    }
  else if(args.size() > 5)
    {
    this->SetError("sub-command TIMESTAMP takes at most four arguments.");
    return false;
    }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  std::string formatString;
  if(args.size() > argsIndex && args[argsIndex] != "UTC")
    {
    formatString = args[argsIndex++];
    }

  bool utcFlag = false;
  if(args.size() > argsIndex)
    {
    if(args[argsIndex] == "UTC")
      {
      utcFlag = true;
      }
    else
      {
      std::string e = " TIMESTAMP sub-command does not recognize option " +
          args[argsIndex] + ".";
      this->SetError(e);
      return false;
      }
    }

  cmTimestamp timestamp;
  std::string result = timestamp.FileModificationTime(
    filename.c_str(), formatString, utcFlag);
  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}